

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O1

int stb_idict_init(stb_idict *h,int count)

{
  int iVar1;
  stb__stb_idict__hashpair *psVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  
  uVar6 = 4;
  if (4 < count) {
    uVar6 = (ulong)(uint)count;
  }
  iVar5 = (int)uVar6;
  h->limit = iVar5;
  iVar4 = 0;
  h->count = 0;
  h->mask = iVar5 - 1;
  h->deleted = 0;
  h->grow_threshhold = (int)((float)iVar5 * 0.85);
  h->has_del = '\0';
  h->alloced = '\0';
  h->has_empty = '\0';
  iVar1 = (int)((double)iVar5 * 0.3777777883741591);
  if (count < 0x41) {
    iVar1 = 0;
  }
  h->shrink_threshhold = iVar1;
  h->delete_threshhold = (int)((float)iVar5 * 0.14999998 * 0.5);
  psVar2 = (stb__stb_idict__hashpair *)malloc(uVar6 * 8);
  h->table = psVar2;
  if (psVar2 != (stb__stb_idict__hashpair *)0x0) {
    uVar3 = 0;
    do {
      psVar2[uVar3].k = 1;
      uVar3 = uVar3 + 1;
    } while (uVar6 != uVar3);
    iVar4 = 1;
  }
  return iVar4;
}

Assistant:

stb_define_hash_base(STB_noprefix, stb_idict, short type; short gc; STB_nofields, stb_idict_,stb_idict_,0.85f,
              stb_int32,STB_IEMPTY,STB_IDEL,STB_nocopy,STB_nodelete,STB_nosafe,
              STB_equal,STB_equal,
              return stb_rehash_improved(k);,stb_int32,STB_nonullvalue,0)

stb_idict * stb_idict_new_size(int size)
{
   stb_idict *e = (stb_idict *) malloc(sizeof(*e));
   if (e) {
      if (!stb_is_pow2(size))
         size = 1 << stb_log2_ceil(size);
      stb_idict_init(e, size);
      e->alloced = 1;
   }
   return e;
}